

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::line_end(Fl_Input_ *this,int i)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar5;
  char buf [1024];
  char acStack_428 [1032];
  
  bVar1 = (this->super_Fl_Widget).type_;
  if ((bVar1 & 7) == 4) {
    pcVar4 = (char *)(ulong)(uint)i;
    if ((bVar1 & 0x10) == 0) {
      while ((iVar3 = (int)pcVar4, iVar3 < this->size_ &&
             (pcVar4 = index(this,pcVar4,(int)in_RDX), (int)pcVar4 != 10))) {
        pcVar4 = (char *)(ulong)(iVar3 + 1);
        in_RDX = extraout_RDX;
      }
    }
    else {
      lVar2 = (long)i;
      do {
        lVar5 = lVar2;
        if ((int)lVar5 < 1) break;
        pcVar4 = index(this,(char *)(ulong)((int)lVar5 - 1),(int)in_RDX);
        in_RDX = extraout_RDX_00;
        lVar2 = lVar5 + -1;
      } while ((int)pcVar4 != 10);
      setfont(this);
      pcVar4 = this->value_ + lVar5;
      do {
        pcVar4 = expand(this,pcVar4,acStack_428);
        iVar3 = (int)pcVar4 - *(int *)&this->value_;
        pcVar4 = pcVar4 + 1;
      } while (iVar3 < i);
    }
  }
  else {
    iVar3 = this->size_;
  }
  return iVar3;
}

Assistant:

int Fl_Input_::line_end(int i) const {
  if (input_type() != FL_MULTILINE_INPUT) return size();

  if (wrap()) {
    // go to the start of the paragraph:
    int j = i;
    while (j > 0 && index(j-1) != '\n') j--;
    // now measure lines until we get past i, end of that line is real eol:
    setfont();
    for (const char* p=value()+j; ;) {
      char buf[MAXBUF];
      p = expand(p, buf);
      int k = (int) (p-value());
      if (k >= i) return k;
      p++;
    }
  } else {
    while (i < size() && index(i) != '\n') i++;
    return i;
  }
}